

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktCheck.cpp
# Opt level: O2

void __thiscall KktCheck::chDualFeas(KktCheck *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  pointer pdVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  bool bVar8;
  ostream *poVar9;
  int iVar10;
  char *pcVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  
  bVar8 = true;
  iVar10 = 0;
  while (this->i = iVar10, iVar10 < this->numCol) {
    pdVar4 = (this->colUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar13 = (this->colLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar10];
    if ((((dVar13 != -1e+200) || (NAN(dVar13))) || (dVar14 = pdVar4[iVar10], dVar14 != 1e+200)) ||
       (NAN(dVar14))) {
      dVar14 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar10];
      dVar2 = pdVar4[iVar10];
      if ((dVar14 != dVar13) || (dVar2 <= dVar13)) {
        if ((dVar14 == dVar2) &&
           ((dVar13 < dVar2 &&
            (dVar13 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar10],
            this->tol <= dVar13 && dVar13 != this->tol)))) {
          if (this->print == 1) {
            poVar9 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: x[");
            poVar9 = (ostream *)
                     std::ostream::operator<<
                               (poVar9,(this->cIndexRev).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[this->i]);
            std::operator<<(poVar9,"]=");
            poVar9 = std::ostream::_M_insert<double>
                               ((this->colValue).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            poVar9 = std::operator<<(poVar9,"=u[");
            poVar9 = (ostream *)
                     std::ostream::operator<<
                               (poVar9,(this->cIndexRev).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[this->i]);
            pcVar11 = "], z[";
            goto LAB_0014de37;
          }
          goto LAB_0014de9f;
        }
      }
      else {
        dVar13 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar10];
        if ((dVar13 < 0.0) && (dVar13 = ABS(dVar13), this->tol <= dVar13 && dVar13 != this->tol)) {
          if (this->print == 1) {
            poVar9 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: l[");
            poVar9 = (ostream *)
                     std::ostream::operator<<
                               (poVar9,(this->cIndexRev).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[this->i]);
            std::operator<<(poVar9,"]=");
            poVar9 = std::ostream::_M_insert<double>
                               ((this->colLower).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            poVar9 = std::operator<<(poVar9," = x[");
            poVar9 = (ostream *)
                     std::ostream::operator<<
                               (poVar9,(this->cIndexRev).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[this->i]);
            std::operator<<(poVar9,"]=");
            poVar9 = std::ostream::_M_insert<double>
                               ((this->colValue).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            pcVar11 = ", z[";
LAB_0014de37:
            poVar9 = std::operator<<(poVar9,pcVar11);
            iVar10 = (this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[this->i];
            goto LAB_0014de4d;
          }
LAB_0014de9f:
          bVar8 = false;
        }
      }
    }
    else {
      dVar13 = ABS((this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar10]);
      if (this->tol <= dVar13 && dVar13 != this->tol) {
        if (this->print != 1) goto LAB_0014de9f;
        poVar9 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail: l=-inf, x[");
        poVar9 = (ostream *)
                 std::ostream::operator<<
                           (poVar9,(this->cIndexRev).super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::operator<<(poVar9,"]=");
        poVar9 = std::ostream::_M_insert<double>
                           ((this->colValue).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->i]);
        poVar9 = std::operator<<(poVar9,", u=inf, z[");
        iVar10 = this->i;
LAB_0014de4d:
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar10);
        std::operator<<(poVar9,"]=");
        poVar9 = std::ostream::_M_insert<double>
                           ((this->colDual).super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->i]);
        std::endl<char,std::char_traits<char>>(poVar9);
        bVar8 = false;
      }
    }
    iVar10 = this->i + 1;
  }
  iVar10 = 0;
  do {
    this->i = iVar10;
    if (this->numRow <= iVar10) {
      if (bVar8) {
        if (this->print == 1) {
          std::operator<<((ostream *)&std::cout,"Dual feasible.\n");
          return;
        }
      }
      else {
        if (this->print == 1) {
          std::operator<<((ostream *)&std::cout,"KKT check error: Dual feasibility fail.\n");
        }
        this->istrueGlb = true;
      }
      return;
    }
    piVar5 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar13 = 0.0;
    for (lVar12 = (long)piVar5[iVar10]; this->k = (int)lVar12, lVar12 < piVar5[(long)iVar10 + 1];
        lVar12 = lVar12 + 1) {
      dVar13 = dVar13 + pdVar4[piVar6[lVar12]] * pdVar7[lVar12];
    }
    dVar14 = (this->rowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar10];
    dVar2 = this->tol;
    if (dVar2 <= ABS(dVar14 - dVar13)) {
LAB_0014df8e:
      if ((dVar13 <= dVar14) ||
         (dVar2 <= ABS(dVar13 - (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar10]))) {
        if ((dVar14 < dVar13 + dVar2) &&
           (dVar13 < (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar10] + dVar2)) {
          dVar14 = ABS((this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar10]);
          goto LAB_0014e005;
        }
      }
      else {
        pdVar1 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + iVar10;
        if (*pdVar1 <= -dVar2 && -dVar2 != *pdVar1) goto LAB_0014e00f;
      }
    }
    else {
      dVar3 = (this->rowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar10];
      if (dVar2 <= ABS(dVar3 - dVar13)) {
        if (dVar3 <= dVar13) goto LAB_0014df8e;
        dVar14 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar10];
LAB_0014e005:
        if (dVar2 < dVar14) {
LAB_0014e00f:
          if (this->print == 1) {
            poVar9 = std::operator<<((ostream *)&std::cout,"Dual feasibility fail for row ");
            poVar9 = (ostream *)
                     std::ostream::operator<<
                               (poVar9,(this->rIndexRev).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start[this->i]);
            std::operator<<(poVar9,": L= ");
            poVar9 = std::ostream::_M_insert<double>
                               ((this->rowLower).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            std::operator<<(poVar9,", Ax=");
            poVar9 = std::ostream::_M_insert<double>(dVar13);
            std::operator<<(poVar9,", U=");
            poVar9 = std::ostream::_M_insert<double>
                               ((this->rowUpper).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[this->i]);
            std::operator<<(poVar9,", y=");
            poVar9 = std::ostream::_M_insert<double>
                               ((this->rowDual).super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[this->i]);
            std::endl<char,std::char_traits<char>>(poVar9);
          }
          bVar8 = false;
        }
      }
    }
    iVar10 = this->i + 1;
  } while( true );
}

Assistant:

void KktCheck::chDualFeas() {
	bool istrue = true;
	
	//check values of z_j are dual feasible
	for (i=0; i<numCol;i++) {
		// j not in L or U
		if (colLower[i] == -HSOL_CONST_INF && colUpper[i] == HSOL_CONST_INF) {
			if (abs(colDual[i]) > tol) {
				if (print == 1) 
					cout<<"Dual feasibility fail: l=-inf, x["<<cIndexRev[i]<<"]="<<colValue[i]<<", u=inf, z["<<i<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: l=-inf, x["<<i<<"]="<<colValue[i]<<", u=inf, z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
		// j in L: x=l and l<u
		else if (colValue[i] == colLower[i] && colLower[i] < colUpper[i]) {
			if (colDual[i]<0 && abs(colDual[i]) > tol) {
				if (print == 1)  
					cout<<"Dual feasibility fail: l["<<cIndexRev[i]<<"]="<<colLower[i]<<" = x["<<cIndexRev[i]<<"]="<<colValue[i]<<", z["<<cIndexRev[i]<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: l["<<i<<"]="<<colLower[i]<<" = x["<<i<<"]="<<colValue[i]<<", z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
		// j in U: x=u and l<u
		else if (colValue[i] == colUpper[i] && colLower[i] < colUpper[i]) {
			if (colDual[i]>tol) {
				if (print == 1)  
					cout<<"Dual feasibility fail: x["<<cIndexRev[i]<<"]="<<colValue[i]<<"=u["<<cIndexRev[i]<<"], z["<<cIndexRev[i]<<"]="<<colDual[i]<<endl;
					//cout<<"Dual feasibility fail: x["<<i<<"]="<<colValue[i]<<"=u["<<i<<"], z["<<i<<"]="<<colDual[i]<<endl;
				istrue = false;
			}
		}
	}
	
	//check values of y_i are dual feasible
	for (i=0; i<numRow;i++) {
		double rowV = 0;
		for (k=ARstart[i]; k<ARstart[i+1]; k++)
			rowV = rowV + colValue[ARindex[k]]*ARvalue[k];

		// L = Ax = U can be any sign
		if (abs(rowLower[i] - rowV) < tol && abs(rowUpper[i] - rowV) < tol) {
		}
		// L = Ax < U
		else if (abs(rowLower[i] - rowV) < tol && rowV < rowUpper[i]) {

			if (rowDual[i] > tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
				istrue = false;
			}
		}
		// L < Ax = U
		else if (rowLower[i] < rowV && abs(rowV - rowUpper[i]) < tol) {
			//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
			if (rowDual[i] < -tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
				istrue = false;
			}
		}
		// L < Ax < U
		else if ((rowLower[i] < (rowV+tol)) && (rowV < (rowUpper[i]+tol))) {
			if (abs(rowDual[i]) > tol) {
				if (print == 1)
					cout<<"Dual feasibility fail for row "<<rIndexRev[i]<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;
					//cout<<"Dual feasibility fail for row "<<i<<": L= "<<rowLower[i] <<", Ax="<<rowV<<", U="<<rowUpper[i]<<", y="<<rowDual[i]<<endl;istrue = false;
				istrue = false;
			}
		}
	}
	
	if (istrue) {
		if (print == 1) 
			cout<<"Dual feasible.\n";
	}
	else  {
		if (print == 1) 
			cout<<"KKT check error: Dual feasibility fail.\n";
		istrueGlb = true;
	}
	
}